

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

property_name_and_value * __thiscall
mjs::parser::parse_property_name_and_value
          (property_name_and_value *__return_storage_ptr__,parser *this)

{
  ulong uVar1;
  expression *peVar2;
  version *pvVar3;
  _func_int **pp_Var4;
  _Head_base<0UL,_mjs::expression_*,_false> _Var5;
  element_type *peVar6;
  int iVar7;
  int iVar8;
  wstring *pwVar9;
  wostream *pwVar10;
  expression *e;
  pointer *__ptr;
  ulong uVar11;
  wchar_t *in_R9;
  wstring_view message;
  expression_ptr p;
  expression_ptr new_p;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> id;
  expression_ptr f;
  _Head_base<0UL,_mjs::expression_*,_false> local_268;
  undefined1 local_260 [8];
  undefined1 local_258 [32];
  undefined1 local_238 [48];
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  local_208;
  size_t local_1e8;
  source_extend *local_1e0;
  parser local_1c8 [2];
  token local_50;
  
  local_268._M_head_impl = (expression *)0x0;
  parse_property_name(local_1c8);
  peVar6 = local_1c8[0].source_.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  _Var5._M_head_impl = local_268._M_head_impl;
  local_1c8[0].source_.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_268._M_head_impl = (expression *)peVar6;
  if (_Var5._M_head_impl != (expression *)0x0) {
    (*((_Var5._M_head_impl)->super_syntax_node)._vptr_syntax_node[1])();
  }
  if (local_1c8[0].source_.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    (**(code **)(*(long *)local_1c8[0].source_.
                          super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                8))();
  }
  if (((1 < (int)this->version_) && ((this->current_token_).type_ != colon)) &&
     (iVar7 = (*((local_268._M_head_impl)->super_syntax_node)._vptr_syntax_node[3])(),
     _Var5._M_head_impl = local_268._M_head_impl, iVar7 == 0)) {
    peVar2 = local_268._M_head_impl + 1;
    iVar7 = std::__cxx11::wstring::compare((wchar_t *)peVar2);
    if ((iVar7 == 0) || (iVar8 = std::__cxx11::wstring::compare((wchar_t *)peVar2), iVar8 == 0)) {
      parse_property_name((parser *)local_260);
      pvVar3 = &local_1c8[0].version_;
      pp_Var4 = _Var5._M_head_impl[1].super_syntax_node._vptr_syntax_node;
      local_1c8[0].source_.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)pvVar3;
      std::__cxx11::wstring::_M_construct<wchar_t*>
                ((wstring *)local_1c8,pp_Var4,
                 (long)pp_Var4 +
                 (long)_Var5._M_head_impl[1].super_syntax_node.extend_.file.
                       super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr * 4);
      std::__cxx11::wstring::append((wchar_t *)local_1c8);
      property_name_string_abi_cxx11_((wstring *)local_258,(mjs *)local_260,e);
      uVar1 = (long)&((_Alloc_hider *)local_258._8_8_)->_M_p +
              (long)local_1c8[0].source_.
                    super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
      uVar11 = 3;
      if (local_1c8[0].source_.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)pvVar3) {
        uVar11 = local_1c8[0]._16_8_;
      }
      if (uVar11 < uVar1) {
        uVar11 = 3;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_258 + 0x10)) {
          uVar11 = local_258._16_8_;
        }
        if (uVar11 < uVar1) goto LAB_00174ac4;
        pwVar9 = (wstring *)
                 std::__cxx11::wstring::replace
                           ((ulong)local_258,0,(wchar_t *)0x0,
                            (ulong)local_1c8[0].source_.
                                   super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr);
      }
      else {
LAB_00174ac4:
        pwVar9 = (wstring *)std::__cxx11::wstring::_M_append((wchar_t *)local_1c8,local_258._0_8_);
      }
      std::__cxx11::wstring::wstring((wstring *)&local_208,pwVar9);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_258 + 0x10)) {
        operator_delete((void *)local_258._0_8_,local_258._16_8_ * 4 + 4);
      }
      if (local_1c8[0].source_.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)pvVar3) {
        operator_delete(local_1c8[0].source_.
                        super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        local_1c8[0]._16_8_ * 4 + 4);
      }
      parse_function_abi_cxx11_
                ((tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
                  *)local_258,this);
      if ((long)(local_258._16_8_ - local_258._8_8_) >> 5 != (ulong)(iVar7 != 0)) {
        std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1c8);
        pwVar10 = std::operator<<((wostream *)local_1c8,"Wrong number of arguments to ");
        pwVar10 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                            (pwVar10,(wchar_t *)
                                     _Var5._M_head_impl[1].super_syntax_node._vptr_syntax_node,
                             (long)_Var5._M_head_impl[1].super_syntax_node.extend_.file.
                                   super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr);
        pwVar10 = std::operator<<(pwVar10," ");
        pwVar10 = std::wostream::_M_insert<unsigned_long>((ulong)pwVar10);
        pwVar10 = std::operator<<(pwVar10," expected ");
        std::wostream::_M_insert<unsigned_long>((ulong)pwVar10);
        local_238._24_8_ =
             (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        local_238._32_8_ =
             (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._32_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._32_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._32_8_)->_M_use_count +
                 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._32_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._32_8_)->_M_use_count +
                 1;
          }
        }
        local_238._40_4_ = this->token_start_;
        local_238._44_4_ = (undefined4)(this->lexer_).text_pos_;
        std::__cxx11::wstringbuf::str();
        message._M_str = in_R9;
        message._M_len = local_1e8;
        syntax_error((parser *)"parse_property_name_and_value",(char *)0x449,(int)local_238 + 0x18,
                     local_1e0,message);
      }
      make_expression<mjs::function_expression,mjs::source_extend&,std::__cxx11::wstring_const&,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                (local_1c8,(source_extend *)this,
                 (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 local_238,&local_208,
                 (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)(local_258 + 8)
                );
      property_name_and_value::property_name_and_value
                (__return_storage_ptr__,set - (iVar7 == 0),(expression_ptr *)local_260,
                 (expression_ptr *)local_1c8);
      if (local_1c8[0].source_.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)0x0) {
        (**(code **)(*(long *)local_1c8[0].source_.
                              super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 8))();
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
      }
      std::
      vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)(local_258 + 8));
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (**(code **)(*(long *)local_258._0_8_ + 8))();
      }
      if (local_208.
          super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&local_208.
                    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(local_208.
                        super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_208.
                              super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage * 4 + 4);
      }
      goto LAB_001749c1;
    }
  }
  expect(&local_50,this,colon,"parse_property_name_and_value",0x451);
  token::destroy(&local_50);
  parse_assignment_expression(local_1c8);
  property_name_and_value::property_name_and_value
            (__return_storage_ptr__,normal,(expression_ptr *)&local_268,(expression_ptr *)local_1c8)
  ;
  local_260 = (undefined1  [8])
              local_1c8[0].source_.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
LAB_001749c1:
  if ((tuple<mjs::expression_*,_std::default_delete<mjs::expression>_>)local_260 !=
      (_Head_base<0UL,_mjs::expression_*,_false>)0x0) {
    (**(code **)(*(long *)local_260 + 8))();
  }
  if ((element_type *)local_268._M_head_impl != (element_type *)0x0) {
    (*((local_268._M_head_impl)->super_syntax_node)._vptr_syntax_node[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

property_name_and_value parser::parse_property_name_and_value() {
    expression_ptr p;
    {
        p = parse_property_name();
        // get/set i.e. accessor properties
        if (version_ >= version::es5 && current_token_type() != token_type::colon && p->type() == expression_type::identifier) {
            const auto& p_id = static_cast<const identifier_expression&>(*p).id();
            const bool is_get = p_id == L"get";
            if (is_get || p_id == L"set") {
                auto new_p = parse_property_name();
                const auto id = p_id + L" " + property_name_string(*new_p);
                auto [extend, params, block] = parse_function();
                const size_t expected_args = is_get ? 0 : 1;
                if (expected_args != params.size()) {
                    SYNTAX_ERROR("Wrong number of arguments to " << p_id << " " << params.size() << " expected " << expected_args);
                }

                auto f = make_expression<function_expression>(extend, id, std::move(params), std::move(block));
                return property_name_and_value{is_get ? property_assignment_type::get : property_assignment_type::set, std::move(new_p), std::move(f)};
            }
        }
    }
    EXPECT(token_type::colon);
    return property_name_and_value{property_assignment_type::normal, std::move(p), parse_assignment_expression()};
}